

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O1

void __thiscall
ODDLParser::OpenDDLParserTest_parseDataArrayListTest_Test::
~OpenDDLParserTest_parseDataArrayListTest_Test(OpenDDLParserTest_parseDataArrayListTest_Test *this)

{
  pointer ppVVar1;
  
  (this->super_OpenDDLParserTest).super_Test._vptr_Test =
       (_func_int **)&PTR__OpenDDLParserTest_0018bff0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_OpenDDLParserTest).m_logs);
  ppVVar1 = (this->super_OpenDDLParserTest).m_data.
            super__Vector_base<ODDLParser::Value_*,_std::allocator<ODDLParser::Value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar1 != (pointer)0x0) {
    operator_delete(ppVVar1,(long)(this->super_OpenDDLParserTest).m_data.
                                  super__Vector_base<ODDLParser::Value_*,_std::allocator<ODDLParser::Value_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar1
                   );
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parseDataArrayListTest) {
    char token[] =
            "{\n"
            "    { 1.0, 2.0, 3.0 },\n"
            "    { 0.5, 0.0, 0.5 },\n"
            "    { 0.0, -1.0, 4.0 }\n"
            "}\n";
    size_t len(0);
    char *end(findEnd(token, len));
    DataArrayList *dtArrayList(nullptr);

    char *in = OpenDDLParser::parseDataArrayList(token, end, Value::ValueType::ddl_none, &dtArrayList);
    ASSERT_FALSE(nullptr == dtArrayList);
    const size_t numItems(countItems(dtArrayList->m_dataList));
    EXPECT_NE(token, in);
    EXPECT_EQ(3U, numItems);

    delete dtArrayList;
}